

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# savefile.c
# Opt level: O0

void rd_string(char *str,int max)

{
  int local_1c;
  uint8_t local_15;
  int i;
  uint8_t tmp8u;
  char *pcStack_10;
  int max_local;
  char *str_local;
  
  local_1c = 0;
  i = max;
  pcStack_10 = str;
  do {
    rd_byte(&local_15);
    if (local_1c < i) {
      pcStack_10[local_1c] = local_15;
    }
  } while ((local_15 != '\0') && (local_1c = local_1c + 1, local_1c != 0));
  pcStack_10[i + -1] = '\0';
  return;
}

Assistant:

void rd_string(char *str, int max)
{
	uint8_t tmp8u;
	int i = 0;

	do {
		rd_byte(&tmp8u);

		if (i < max) str[i] = tmp8u;
		if (!tmp8u) break;
	} while (++i);

	str[max - 1] = '\0';
}